

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

ON_Xform * __thiscall ON_Xform::operator=(ON_Xform *this,ON_Matrix *src)

{
  double **ppdVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ON_Xform *pOVar7;
  ON_Xform *pOVar8;
  ulong uVar9;
  uint uVar10;
  double (*padVar11) [4];
  ulong uVar12;
  byte bVar13;
  
  bVar13 = 0;
  uVar3 = ON_Matrix::RowCount(src);
  uVar4 = ON_Matrix::ColCount(src);
  uVar10 = 4;
  if ((int)uVar4 < 4) {
    uVar10 = uVar4;
  }
  pOVar7 = &IdentityTransformation;
  pOVar8 = this;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pOVar8->m_xform[0][0] = pOVar7->m_xform[0][0];
    pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar8 = (ON_Xform *)((long)pOVar8 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  if (0 < (int)uVar3) {
    uVar6 = 4;
    if ((int)uVar3 < 4) {
      uVar6 = (ulong)uVar3;
    }
    ppdVar1 = src->m;
    uVar9 = 0;
    padVar11 = (double (*) [4])this;
    do {
      if (0 < (int)uVar4) {
        pdVar2 = ppdVar1[uVar9];
        uVar12 = 0;
        do {
          (*(double (*) [4])*padVar11)[uVar12] = pdVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      uVar9 = uVar9 + 1;
      padVar11 = padVar11 + 1;
    } while (uVar9 != uVar6);
  }
  return this;
}

Assistant:

ON_Xform& ON_Xform::operator=(const ON_Matrix& src)
{
  int i,j;
  i = src.RowCount();
  const int maxi = (i>4)?4:i;
  j = src.ColCount();
  const int maxj = (j>4)?4:j;
  *this = ON_Xform::IdentityTransformation;
  for ( i = 0; i < maxi; i++ ) for ( j = 0; j < maxj; j++ ) {
    m_xform[i][j] = src.m[i][j];
  }
  return *this;
}